

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadString(CodedInputStream *input,string *value)

{
  uint8 *puVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_RAX;
  pointer __dest;
  size_t __n;
  uint32 length;
  undefined8 uStack_28;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (-1 < (char)*puVar1)) {
    uStack_28 = CONCAT44((int)(char)*puVar1,(int)in_RAX);
    input->buffer_ = puVar1 + 1;
  }
  else {
    uStack_28 = in_RAX;
    bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&uStack_28 + 4));
    if (!bVar3) {
      return false;
    }
  }
  iVar2 = uStack_28._4_4_;
  __n = (size_t)uStack_28._4_4_;
  if ((long)__n < 0) {
    return false;
  }
  if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < uStack_28._4_4_) {
    bVar3 = io::CodedInputStream::ReadStringFallback(input,value,uStack_28._4_4_);
    return bVar3;
  }
  std::__cxx11::string::resize((ulong)value,(char)((ulong)uStack_28 >> 0x20));
  if (iVar2 != 0) {
    if (value->_M_string_length == 0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = (value->_M_dataplus)._M_p;
    }
    memcpy(__dest,input->buffer_,__n);
    input->buffer_ = input->buffer_ + __n;
    return true;
  }
  return true;
}

Assistant:

bool WireFormatLite::ReadString(io::CodedInputStream* input,
                                string* value) {
  // String is for UTF-8 text only
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->InternalReadStringInline(value, length)) return false;
  return true;
}